

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O3

void __thiscall testing::internal::ExpectationBase::~ExpectationBase(ExpectationBase *this)

{
  pointer ppvVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  this->_vptr_ExpectationBase = (_func_int **)&PTR__ExpectationBase_0014db68;
  Mutex::~Mutex(&this->mutex_);
  ppvVar1 = (this->untyped_actions_).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppvVar1 != (pointer)0x0) {
    operator_delete(ppvVar1,(long)(this->untyped_actions_).
                                  super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppvVar1)
    ;
  }
  std::
  _Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
  ::_M_erase((_Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
              *)&this->immediate_prerequisites_,
             (_Link_type)
             (this->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_parent);
  this_00 = (this->cardinality_).impl_.
            super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pcVar2 = (this->description_)._M_dataplus._M_p;
  paVar3 = &(this->description_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->source_text_)._M_dataplus._M_p;
  paVar3 = &(this->source_text_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

ExpectationBase::~ExpectationBase() = default;